

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

_Bool hdr_record_corrected_values_atomic
                (hdr_histogram *h,int64_t value,int64_t count,int64_t expected_interval)

{
  _Bool _Var1;
  long local_38;
  int64_t missing_value;
  int64_t expected_interval_local;
  int64_t count_local;
  int64_t value_local;
  hdr_histogram *h_local;
  
  _Var1 = hdr_record_values_atomic(h,value,count);
  if (_Var1) {
    if ((expected_interval < 1) || (value <= expected_interval)) {
      h_local._7_1_ = true;
    }
    else {
      for (local_38 = value - expected_interval; expected_interval <= local_38;
          local_38 = local_38 - expected_interval) {
        _Var1 = hdr_record_values_atomic(h,local_38,count);
        if (!_Var1) {
          return false;
        }
      }
      h_local._7_1_ = true;
    }
  }
  else {
    h_local._7_1_ = false;
  }
  return h_local._7_1_;
}

Assistant:

bool hdr_record_corrected_values_atomic(struct hdr_histogram* h, int64_t value, int64_t count, int64_t expected_interval)
{
    int64_t missing_value;

    if (!hdr_record_values_atomic(h, value, count))
    {
        return false;
    }

    if (expected_interval <= 0 || value <= expected_interval)
    {
        return true;
    }

    missing_value = value - expected_interval;
    for (; missing_value >= expected_interval; missing_value -= expected_interval)
    {
        if (!hdr_record_values_atomic(h, missing_value, count))
        {
            return false;
        }
    }

    return true;
}